

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O0

REF_STATUS
ref_split_edge_density
          (REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node,REF_BOOL *allowed)

{
  REF_NODE ref_node_00;
  REF_CELL ref_cell_00;
  uint uVar1;
  double dVar2;
  REF_INT local_f8;
  REF_INT local_f4;
  int local_f0;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL hits;
  REF_DBL density;
  REF_DBL area;
  int local_c0;
  REF_INT node;
  REF_INT cell_node;
  REF_INT item;
  REF_INT nodes [27];
  REF_INT local_44;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_BOOL *allowed_local;
  REF_INT new_node_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  *allowed = 1;
  if (ref_grid->twod != 0) {
    ref_cell_00 = ref_grid->cell[3];
    hits = 0.0;
    _ref_private_macro_code_rss_1 = 0.0;
    if ((node0 < 0) || (ref_cell_00->ref_adj->nnode <= node0)) {
      local_f0 = -1;
    }
    else {
      local_f0 = ref_cell_00->ref_adj->first[node0];
    }
    node = local_f0;
    if (local_f0 == -1) {
      local_f4 = -1;
    }
    else {
      local_f4 = ref_cell_00->ref_adj->item[local_f0].ref;
    }
    local_44 = local_f4;
    while (node != -1) {
      for (local_c0 = 0; local_c0 < ref_cell_00->node_per; local_c0 = local_c0 + 1) {
        if (node1 == ref_cell_00->c2n[local_c0 + ref_cell_00->size_per * local_44]) {
          uVar1 = ref_cell_nodes(ref_cell_00,local_44,&cell_node);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x2d0,"ref_split_edge_density",(ulong)uVar1,"cell nodes");
            return uVar1;
          }
          for (area._4_4_ = 0; area._4_4_ < ref_cell_00->node_per; area._4_4_ = area._4_4_ + 1) {
            if (node0 == (&cell_node)[area._4_4_]) {
              (&cell_node)[area._4_4_] = new_node;
            }
          }
          uVar1 = ref_node_tri_metric_area(ref_node_00,&cell_node,&density);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x2d4,"ref_split_edge_density",(ulong)uVar1,"tri area");
            return uVar1;
          }
          dVar2 = density + hits;
          for (area._4_4_ = 0; area._4_4_ < ref_cell_00->node_per; area._4_4_ = area._4_4_ + 1) {
            if (new_node == (&cell_node)[area._4_4_]) {
              (&cell_node)[area._4_4_] = node0;
            }
          }
          for (area._4_4_ = 0; area._4_4_ < ref_cell_00->node_per; area._4_4_ = area._4_4_ + 1) {
            if (node1 == (&cell_node)[area._4_4_]) {
              (&cell_node)[area._4_4_] = new_node;
            }
          }
          uVar1 = ref_node_tri_metric_area(ref_node_00,&cell_node,&density);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x2de,"ref_split_edge_density",(ulong)uVar1,"tri area");
            return uVar1;
          }
          hits = density + dVar2;
          _ref_private_macro_code_rss_1 = _ref_private_macro_code_rss_1 + 1.0 + 1.0;
        }
      }
      node = ref_cell_00->ref_adj->item[node].next;
      if (node == -1) {
        local_f8 = -1;
      }
      else {
        local_f8 = ref_cell_00->ref_adj->item[node].ref;
      }
      local_44 = local_f8;
    }
    if (0.5 < _ref_private_macro_code_rss_1) {
      hits = hits / _ref_private_macro_code_rss_1;
    }
    if (hits <= 0.5) {
      *allowed = 0;
    }
    else {
      *allowed = 1;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_split_edge_density(REF_GRID ref_grid, REF_INT node0,
                                          REF_INT node1, REF_INT new_node,
                                          REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, cell_node;
  REF_INT node;
  REF_DBL area, density, hits;

  *allowed = REF_TRUE;

  if (!ref_grid_twod(ref_grid)) {
    return REF_SUCCESS;
  }

  ref_cell = ref_grid_tri(ref_grid);

  density = 0.0;
  hits = 0.0;
  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node0 == nodes[node]) nodes[node] = new_node;
    }
    RSS(ref_node_tri_metric_area(ref_node, nodes, &area), "tri area");
    density += area;
    hits += 1.0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (new_node == nodes[node]) nodes[node] = node0;
    }
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node1 == nodes[node]) nodes[node] = new_node;
    }
    RSS(ref_node_tri_metric_area(ref_node, nodes, &area), "tri area");
    density += area;
    hits += 1.0;
  }

  if (hits > 0.5) density /= hits;

  if (density > 0.5) {
    *allowed = REF_TRUE;
  } else {
    *allowed = REF_FALSE;
  }

  return REF_SUCCESS;
}